

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GenericData.hpp
# Opt level: O0

void __thiscall
OpenMD::SimpleTypeData<OpenMD::FuncflParameters>::~SimpleTypeData
          (SimpleTypeData<OpenMD::FuncflParameters> *this)

{
  SimpleTypeData<OpenMD::FuncflParameters> *in_RDI;
  
  ~SimpleTypeData(in_RDI);
  operator_delete(in_RDI,0xa8);
  return;
}

Assistant:

SimpleTypeData(const std::string& id) :
        GenericData(id), data_(ElemDataType()) {}